

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<double,QColor>>::emplace<std::pair<double,QColor>const&>
          (QMovableArrayOps<std::pair<double,_QColor>_> *this,qsizetype i,pair<double,_QColor> *args
          )

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  pair<double,_QColor> *ppVar4;
  Inserter *in_RDX;
  pair<double,_QColor> *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  pair<double,_QColor> tmp;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9e;
  byte bVar7;
  Inserter *this_00;
  Inserter local_48;
  QArrayDataPointer<std::pair<double,_QColor>_> *local_20;
  pair<double,_QColor> *local_18;
  pair<double,_QColor> *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<std::pair<double,_QColor>_>::needsDetach
                    ((QArrayDataPointer<std::pair<double,_QColor>_> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<std::pair<double,_QColor>_>::freeSpaceAtEnd
                          ((QArrayDataPointer<std::pair<double,_QColor>_> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT24(in_stack_ffffffffffffff9c,
                                                            in_stack_ffffffffffffff98)))),
       qVar3 != 0)) {
      ppVar4 = QArrayDataPointer<std::pair<double,_QColor>_>::end
                         ((QArrayDataPointer<std::pair<double,_QColor>_> *)in_RDI);
      ppVar4->first = (double)in_RDX->data;
      *(pair<double,_QColor> **)&ppVar4->second = in_RDX->displaceFrom;
      *(pair<double,_QColor> **)((long)&(ppVar4->second).ct + 4) = in_RDX->displaceTo;
      in_RDI->displaceTo = (pair<double,_QColor> *)((long)&in_RDI->displaceTo->first + 1);
      goto LAB_004a5904;
    }
    if ((in_RSI == (pair<double,_QColor> *)0x0) &&
       (qVar3 = QArrayDataPointer<std::pair<double,_QColor>_>::freeSpaceAtBegin
                          ((QArrayDataPointer<std::pair<double,_QColor>_> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT24(in_stack_ffffffffffffff9c,
                                                            in_stack_ffffffffffffff98)))),
       qVar3 != 0)) {
      ppVar4 = QArrayDataPointer<std::pair<double,_QColor>_>::begin
                         ((QArrayDataPointer<std::pair<double,_QColor>_> *)0x4a57a5);
      ppVar4[-1].first = (double)in_RDX->data;
      *(pair<double,_QColor> **)&ppVar4[-1].second = in_RDX->displaceFrom;
      *(pair<double,_QColor> **)((long)&ppVar4[-1].second.ct + 4) = in_RDX->displaceTo;
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (pair<double,_QColor> *)((long)&in_RDI->displaceTo->first + 1);
      goto LAB_004a5904;
    }
  }
  local_20 = in_RDX->data;
  local_18 = in_RDX->displaceFrom;
  local_10 = in_RDX->displaceTo;
  bVar5 = in_RDI->displaceTo != (pair<double,_QColor> *)0x0;
  uVar6 = bVar5 && in_RSI == (pair<double,_QColor> *)0x0;
  uVar2 = (uint)(bVar5 && in_RSI == (pair<double,_QColor> *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<std::pair<double,_QColor>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<double,_QColor>_> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (pair<double,_QColor> **)
             CONCAT17(uVar1,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff9c,uVar2))),
             (QArrayDataPointer<std::pair<double,_QColor>_> *)in_RDI);
  if ((bVar7 & 1) == 0) {
    QMovableArrayOps<std::pair<double,_QColor>_>::Inserter::Inserter
              (in_RDX,(QArrayDataPointer<std::pair<double,_QColor>_> *)
                      CONCAT17(uVar1,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffff9c,uVar2))),
               (qsizetype)in_RDI,CONCAT17(uVar6,in_stack_ffffffffffffff88));
    QMovableArrayOps<std::pair<double,_QColor>_>::Inserter::insertOne
              (in_RDI,(pair<double,_QColor> *)CONCAT17(uVar6,in_stack_ffffffffffffff88));
    QMovableArrayOps<std::pair<double,_QColor>_>::Inserter::~Inserter(&local_48);
  }
  else {
    ppVar4 = QArrayDataPointer<std::pair<double,_QColor>_>::begin
                       ((QArrayDataPointer<std::pair<double,_QColor>_> *)0x4a5895);
    ppVar4[-1].first = (double)local_20;
    *(pair<double,_QColor> **)&ppVar4[-1].second = local_18;
    *(pair<double,_QColor> **)((long)&ppVar4[-1].second.ct + 4) = local_10;
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (pair<double,_QColor> *)((long)&in_RDI->displaceTo->first + 1);
  }
LAB_004a5904:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }